

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal-info.c
# Opt level: O0

void print_info_dk(wal_dk_header header)

{
  uint local_c;
  int i;
  
  printf("Name: %.*s\n",0x20,&stack0x0000000c);
  printf("Width: %d\n",(ulong)(uint)header.name._24_4_);
  printf("Height: %d\n",(ulong)(uint)header.name._28_4_);
  for (local_c = 0; (int)local_c < 9; local_c = local_c + 1) {
    printf("MIP %d offset: %#010x\n",(ulong)local_c,(ulong)header.offsets[(long)(int)local_c + -2]);
  }
  printf("Next frame name: %.*s\n",0x20,header.offsets + 7);
  printf("Flags: %#010x\n",(ulong)(uint)header.animname._24_4_);
  printf("Contents: %#010x\n",(ulong)(uint)header.animname._28_4_);
  printf("Value: %#010x\n",(ulong)(uint)header.palette._760_4_);
  printf("Palette:\n");
  for (local_c = 0; (int)local_c < 0x100; local_c = local_c + 3) {
    printf("#%02x%02x%02x\n",(ulong)header.palette[(long)(int)local_c + -8],
           (ulong)header.palette[(long)(int)(local_c + 1) + -8],
           (ulong)header.palette[(long)(int)(local_c + 2) + -8]);
  }
  return;
}

Assistant:

static void print_info_dk(struct wal_dk_header header)
{
	int i;
	printf("Name: %.*s\n", NAME_LEN, header.name);
	printf("Width: %d\n", header.width);
	printf("Height: %d\n", header.height);
	for (i = 0; i < MIP_LEVELS_DK; i++) {
		printf("MIP %d offset: %#010x\n", i, header.offsets[i]);
	}
	printf("Next frame name: %.*s\n", NAME_LEN, header.animname);
	printf("Flags: %#010x\n", header.flags);
	printf("Contents: %#010x\n", header.contents);
	printf("Value: %#010x\n", header.value);
	printf("Palette:\n");
	for (i = 0; i < DK_PALETTE_ENTRIES; i += 3) {
		printf("#%02x%02x%02x\n", header.palette[i], header.palette[i + 1],
			   header.palette[i + 2]);
	}
}